

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void encode_growbuffer(upb_encstate *e,size_t bytes)

{
  char *pcVar1;
  char *pcVar2;
  size_t oldsize;
  size_t size;
  char *__src;
  char *new_buf;
  size_t new_size;
  size_t needed_size;
  size_t old_size;
  size_t bytes_local;
  upb_encstate *e_local;
  
  oldsize = (long)e->limit - (long)e->buf;
  pcVar1 = e->limit;
  pcVar2 = e->ptr;
  size = upb_roundup_pow2((size_t)(pcVar1 + (bytes - (long)pcVar2)));
  __src = (char *)upb_Arena_Realloc(e->arena,e->buf,oldsize,size);
  if (__src == (char *)0x0) {
    encode_err(e,kUpb_EncodeStatus_OutOfMemory);
  }
  if (oldsize != 0) {
    memmove(__src + (size - oldsize),__src,oldsize);
  }
  e->buf = __src;
  e->limit = __src + size;
  e->ptr = __src + (size - (long)(pcVar1 + (bytes - (long)pcVar2)));
  return;
}

Assistant:

UPB_NOINLINE
static void encode_growbuffer(upb_encstate* e, size_t bytes) {
  size_t old_size = e->limit - e->buf;
  size_t needed_size = bytes + (e->limit - e->ptr);
  size_t new_size = upb_roundup_pow2(needed_size);
  char* new_buf = upb_Arena_Realloc(e->arena, e->buf, old_size, new_size);

  if (!new_buf) encode_err(e, kUpb_EncodeStatus_OutOfMemory);

  // We want previous data at the end, realloc() put it at the beginning.
  // TODO: This is somewhat inefficient since we are copying twice.
  // Maybe create a realloc() that copies to the end of the new buffer?
  if (old_size > 0) {
    memmove(new_buf + new_size - old_size, new_buf, old_size);
  }

  e->buf = new_buf;
  e->limit = new_buf + new_size;
  e->ptr = new_buf + new_size - needed_size;
}